

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

int lyv_list_uniq_equal(void *val1_p,void *val2_p,int UNUSED_mod,void *cb_data)

{
  lyd_node *list;
  lys_node *node;
  lyd_node *list_00;
  ly_ctx *ctx;
  lys_ext_instance **pplVar1;
  int iVar2;
  lyd_node *plVar3;
  lys_module *module;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  hash_table *local_60;
  char *val1;
  char *val2;
  char *path1;
  char *path2;
  void *local_38;
  
  if ((val1_p == (void *)0x0) || (val2_p == (void *)0x0)) {
    __assert_fail("val1_p && val2_p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x96,"int lyv_list_uniq_equal(void *, void *, int, void *)");
  }
  list = *val1_p;
  if ((list == (lyd_node *)0x0) || (node = list->schema, node->nodetype != LYS_LIST)) {
    __assert_fail("first && (first->schema->nodetype == LYS_LIST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x9c,"int lyv_list_uniq_equal(void *, void *, int, void *)");
  }
  list_00 = *val2_p;
  if ((list_00 == (lyd_node *)0x0) || (list_00->schema != node)) {
    __assert_fail("second && (second->schema == first->schema)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x9d,"int lyv_list_uniq_equal(void *, void *, int, void *)");
  }
  ctx = node->module->ctx;
  uVar6 = 0;
  iVar2 = (int)cb_data;
  local_38 = cb_data;
  if (iVar2 < 1) goto LAB_0011fe37;
  uVar6 = 0;
  if ((int)(uint)node->padding[3] < iVar2) goto LAB_0011fe37;
  uVar6 = iVar2 - 1;
  do {
    pcVar7 = (char *)(ulong)uVar6;
    pplVar1 = node[1].ext;
    uVar6 = 0;
    path2 = pcVar7;
    if (*(char *)(pplVar1 + (long)pcVar7 * 2 + 1) != '\0') {
      uVar5 = 0;
      do {
        plVar3 = resolve_data_descendant_schema_nodeid
                           ((char *)(&pplVar1[(long)pcVar7 * 2]->def)[uVar5],list->child);
        if (plVar3 == (lyd_node *)0x0) {
          iVar2 = lyd_get_unique_default
                            ((char *)(&node[1].ext[(long)pcVar7 * 2]->def)[uVar5],list,
                             (char **)&local_60);
          if (iVar2 != 0) {
            return 1;
          }
        }
        else {
          local_60 = plVar3->ht;
        }
        plVar3 = resolve_data_descendant_schema_nodeid
                           ((char *)(&node[1].ext[(long)pcVar7 * 2]->def)[uVar5],list_00->child);
        if (plVar3 == (lyd_node *)0x0) {
          iVar2 = lyd_get_unique_default
                            ((char *)(&node[1].ext[(long)pcVar7 * 2]->def)[uVar5],list_00,&val1);
          if (iVar2 != 0) {
            return 1;
          }
        }
        else {
          val1 = (char *)plVar3->ht;
        }
        if (((local_60 == (hash_table *)0x0) || (val1 == (char *)0x0)) ||
           (local_60 != (hash_table *)val1)) break;
        uVar5 = uVar5 + 1;
        pplVar1 = node[1].ext;
      } while (uVar5 < *(byte *)(pplVar1 + (long)pcVar7 * 2 + 1));
      uVar6 = (uint)uVar5;
      cb_data = local_38;
    }
    if ((uVar6 != 0) && (uVar6 == *(byte *)(node[1].ext + (long)pcVar7 * 2 + 1))) {
      ly_vlog_build_path(LY_VLOG_LYD,list,&val2,0,0);
      ly_vlog_build_path(LY_VLOG_LYD,list_00,&path1,0,0);
      local_38 = malloc(0x400);
      if (*(char *)(node[1].ext + (long)pcVar7 * 2 + 1) == '\0') goto LAB_0012000f;
      uVar5 = 0;
      pcVar4 = (char *)0x0;
      break;
    }
    if (0 < (int)cb_data) {
      return 0;
    }
    uVar6 = (int)path2 + 1;
LAB_0011fe37:
    if ((int)(uint)node->padding[3] <= (int)uVar6) {
      return 0;
    }
  } while( true );
  while( true ) {
    pcVar4 = (char *)(ulong)(uint)((int)path2 + iVar2);
    uVar5 = uVar5 + 1;
    if (*(byte *)(node[1].ext + (long)pcVar7 * 2 + 1) <= uVar5) break;
    path2 = pcVar4;
    if (uVar5 != 0) {
      *(undefined1 *)((long)local_38 + ((ulong)pcVar4 & 0xffff)) = 0x20;
      path2 = (char *)(ulong)((int)pcVar4 + 1);
    }
    module = lys_node_module(node);
    iVar2 = lyd_build_relative_data_path
                      (module,list,(char *)(&node[1].ext[(long)pcVar7 * 2]->def)[uVar5],
                       (char *)(((ulong)path2 & 0xffff) + (long)local_38));
    if (iVar2 == -1) goto LAB_00120036;
  }
LAB_0012000f:
  ly_vlog(ctx,LYE_NOUNIQ,LY_VLOG_LYD,list_00,local_38,val2,path1);
LAB_00120036:
  free(val2);
  free(path1);
  free(local_38);
  return 1;
}

Assistant:

static int
lyv_list_uniq_equal(void *val1_p, void *val2_p, int UNUSED(mod), void *cb_data)
{
    struct ly_ctx *ctx;
    struct lys_node_list *slist;
    struct lyd_node *diter, *first, *second;
    const char *val1, *val2;
    char *path1, *path2, *uniq_str;
    uint16_t idx_uniq;
    int i, j, r, action;

    assert(val1_p && val2_p);

    first = *((struct lyd_node **)val1_p);
    second = *((struct lyd_node **)val2_p);
    action = (intptr_t)cb_data;

    assert(first && (first->schema->nodetype == LYS_LIST));
    assert(second && (second->schema == first->schema));

    ctx = first->schema->module->ctx;

    slist = (struct lys_node_list *)first->schema;

    /* compare unique leaves */
    if (action > 0) {
        i = action - 1;
        if (i < slist->unique_size) {
            goto uniquecheck;
        }
    }
    for (i = 0; i < slist->unique_size; i++) {
uniquecheck:
        for (j = 0; j < slist->unique[i].expr_size; j++) {
            /* first */
            diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], first->child);
            if (diter) {
                val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
            } else {
                /* use default value */
                if (lyd_get_unique_default(slist->unique[i].expr[j], first, &val1)) {
                    return 1;
                }
            }

            /* second */
            diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], second->child);
            if (diter) {
                val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
            } else {
                /* use default value */
                if (lyd_get_unique_default(slist->unique[i].expr[j], second, &val2)) {
                    return 1;
                }
            }

            if (!val1 || !val2 || !ly_strequal(val1, val2, 1)) {
                /* values differ or either one is not set */
                break;
            }
        }
        if (j && (j == slist->unique[i].expr_size)) {
            /* all unique leafs are the same in this set, create this nice error */
            ly_vlog_build_path(LY_VLOG_LYD, first, &path1, 0, 0);
            ly_vlog_build_path(LY_VLOG_LYD, second, &path2, 0, 0);

            /* use buffer to rebuild the unique string */
            uniq_str = malloc(1024);
            idx_uniq = 0;
            for (j = 0; j < slist->unique[i].expr_size; ++j) {
                if (j) {
                    uniq_str[idx_uniq++] = ' ';
                }
                r = lyd_build_relative_data_path(lys_node_module((struct lys_node *)slist), first,
                                                 slist->unique[i].expr[j], &uniq_str[idx_uniq]);
                if (r == -1) {
                    goto unique_errmsg_cleanup;
                }
                idx_uniq += r;
            }

            LOGVAL(ctx, LYE_NOUNIQ, LY_VLOG_LYD, second, uniq_str, path1, path2);
unique_errmsg_cleanup:
            free(path1);
            free(path2);
            free(uniq_str);
            return 1;
        }

        if (action > 0) {
            /* done */
            return 0;
        }
    }

    return 0;
}